

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.h
# Opt level: O2

bool CoreML::Specification::operator==(LinkedModel *a,LinkedModel *b)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  LinkedModelFile *pLVar3;
  StringParameter *pSVar4;
  
  if (a->_oneof_case_[0] != b->_oneof_case_[0]) {
    return false;
  }
  if (a->_oneof_case_[0] == 1) {
    pLVar3 = LinkedModel::linkedmodelfile(a);
    pSVar4 = pLVar3->linkedmodelfilename_;
    if (pSVar4 == (StringParameter *)0x0) {
      pSVar4 = (StringParameter *)&_StringParameter_default_instance_;
    }
    pbVar1 = (pSVar4->defaultvalue_).ptr_;
    pLVar3 = LinkedModel::linkedmodelfile(b);
    pSVar4 = pLVar3->linkedmodelfilename_;
    if (pSVar4 == (StringParameter *)0x0) {
      pSVar4 = (StringParameter *)&_StringParameter_default_instance_;
    }
    bVar2 = std::operator!=(pbVar1,(pSVar4->defaultvalue_).ptr_);
    if (!bVar2) {
      pLVar3 = LinkedModel::linkedmodelfile(a);
      pSVar4 = pLVar3->linkedmodelsearchpath_;
      if (pSVar4 == (StringParameter *)0x0) {
        pSVar4 = (StringParameter *)&_StringParameter_default_instance_;
      }
      pbVar1 = (pSVar4->defaultvalue_).ptr_;
      pLVar3 = LinkedModel::linkedmodelfile(b);
      pSVar4 = pLVar3->linkedmodelsearchpath_;
      if (pSVar4 == (StringParameter *)0x0) {
        pSVar4 = (StringParameter *)&_StringParameter_default_instance_;
      }
      bVar2 = std::operator!=(pbVar1,(pSVar4->defaultvalue_).ptr_);
      if (!bVar2) goto LAB_0026ded5;
    }
    bVar2 = false;
  }
  else {
LAB_0026ded5:
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

inline LinkedModel::LinkTypeCase LinkedModel::LinkType_case() const {
  return LinkedModel::LinkTypeCase(_oneof_case_[0]);
}